

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

CCPrepare * gen_prepare_cc(CCPrepare *__return_storage_ptr__,DisasContext *s,int b,TCGv_i64 reg)

{
  TCGCond TVar1;
  undefined4 local_220 [2];
  TCGContext *local_218;
  undefined8 local_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined4 local_1f0 [2];
  TCGContext *local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8;
  undefined1 local_1c7;
  CCPrepare local_1c0;
  CCPrepare local_190;
  undefined4 local_160 [2];
  TCGv_i64 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined1 local_138;
  undefined1 local_137;
  CCPrepare local_130;
  CCPrepare local_100;
  CCPrepare local_d0;
  undefined4 local_a0 [2];
  TCGv_i64 local_98;
  TCGv_i64 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined1 local_78;
  undefined1 local_77;
  undefined4 local_70 [2];
  TCGv_i64 local_68;
  TCGv_i64 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined1 local_47;
  TCGv_i64 local_40;
  TCGv_i64 t0;
  MemOp size;
  int cond;
  int jcc_op;
  int inv;
  TCGContext *tcg_ctx;
  TCGv_i64 reg_local;
  DisasContext *pDStack_10;
  int b_local;
  DisasContext *s_local;
  
  _jcc_op = s->uc->tcg_ctx;
  cond = b & 1;
  size = (uint)b >> 1 & MO_SSIZE;
  tcg_ctx = (TCGContext *)reg;
  reg_local._4_4_ = b;
  pDStack_10 = s;
  if (s->cc_op - CC_OP_SUBB < 4) {
    t0._0_4_ = s->cc_op - MO_BESL;
    if (size == MO_64) {
      tcg_gen_mov_i64_x86_64(_jcc_op,s->tmp4,s->cc_srcT);
      gen_extu(_jcc_op,(MemOp)t0,pDStack_10->tmp4);
      local_60 = gen_ext_tl(_jcc_op,pDStack_10->tmp0,_jcc_op->cpu_cc_src,(MemOp)t0,false);
      local_70[0] = 0xc;
      local_68 = pDStack_10->tmp4;
      local_58 = 0;
      local_50 = 0xffffffffffffffff;
      local_48 = 1;
      local_47 = 0;
      local_40 = local_60;
      memcpy(__return_storage_ptr__,local_70,0x30);
      goto LAB_0056194d;
    }
    if (size == MO_LESL) {
      t0._4_4_ = 2;
    }
    else {
      if (size != MO_SSIZE) goto LAB_00561637;
      t0._4_4_ = 10;
    }
    tcg_gen_mov_i64_x86_64(_jcc_op,s->tmp4,s->cc_srcT);
    gen_exts(_jcc_op,(MemOp)t0,pDStack_10->tmp4);
    local_90 = gen_ext_tl(_jcc_op,pDStack_10->tmp0,_jcc_op->cpu_cc_src,(MemOp)t0,true);
    local_a0[0] = t0._4_4_;
    local_98 = pDStack_10->tmp4;
    local_88 = 0;
    local_80 = 0xffffffffffffffff;
    local_78 = 1;
    local_77 = 0;
    local_40 = local_90;
    memcpy(__return_storage_ptr__,local_a0,0x30);
  }
  else {
LAB_00561637:
    switch(size) {
    case MO_8:
      gen_prepare_eflags_o(&local_d0,s,reg);
      memcpy(__return_storage_ptr__,&local_d0,0x30);
      break;
    case MO_16:
      gen_prepare_eflags_c(&local_100,s,reg);
      memcpy(__return_storage_ptr__,&local_100,0x30);
      break;
    case MO_32:
      gen_prepare_eflags_z(&local_130,s,reg);
      memcpy(__return_storage_ptr__,&local_130,0x30);
      break;
    case MO_64:
      gen_compute_eflags(s);
      local_160[0] = 9;
      local_158 = _jcc_op->cpu_cc_src;
      local_150 = 0;
      local_148 = 0;
      local_140 = 0x41;
      local_138 = 0;
      local_137 = 0;
      memcpy(__return_storage_ptr__,local_160,0x30);
      break;
    case MO_ASHIFT:
      gen_prepare_eflags_s(&local_190,s,reg);
      memcpy(__return_storage_ptr__,&local_190,0x30);
      break;
    case MO_LESW:
      gen_prepare_eflags_p(&local_1c0,s,reg);
      memcpy(__return_storage_ptr__,&local_1c0,0x30);
      break;
    case MO_LESL:
      gen_compute_eflags(s);
      if (tcg_ctx == (TCGContext *)_jcc_op->cpu_cc_src) {
        tcg_ctx = (TCGContext *)pDStack_10->tmp0;
      }
      tcg_gen_shri_i64_x86_64(_jcc_op,(TCGv_i64)tcg_ctx,_jcc_op->cpu_cc_src,4);
      tcg_gen_xor_i64_x86_64(_jcc_op,(TCGv_i64)tcg_ctx,(TCGv_i64)tcg_ctx,_jcc_op->cpu_cc_src);
      local_1f0[0] = 9;
      local_1e8 = tcg_ctx;
      local_1e0 = 0;
      local_1d8 = 0;
      local_1d0 = 0x80;
      local_1c8 = 0;
      local_1c7 = 0;
      memcpy(__return_storage_ptr__,local_1f0,0x30);
      break;
    default:
      gen_compute_eflags(s);
      if (tcg_ctx == (TCGContext *)_jcc_op->cpu_cc_src) {
        tcg_ctx = (TCGContext *)pDStack_10->tmp0;
      }
      tcg_gen_shri_i64_x86_64(_jcc_op,(TCGv_i64)tcg_ctx,_jcc_op->cpu_cc_src,4);
      tcg_gen_xor_i64_x86_64(_jcc_op,(TCGv_i64)tcg_ctx,(TCGv_i64)tcg_ctx,_jcc_op->cpu_cc_src);
      local_220[0] = 9;
      local_218 = tcg_ctx;
      local_210 = 0;
      local_208 = 0;
      local_200 = 0xc0;
      local_1f8 = 0;
      local_1f7 = 0;
      memcpy(__return_storage_ptr__,local_220,0x30);
    }
  }
LAB_0056194d:
  if (cond != 0) {
    TVar1 = tcg_invert_cond(__return_storage_ptr__->cond);
    __return_storage_ptr__->cond = TVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

static CCPrepare gen_prepare_cc(DisasContext *s, int b, TCGv reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int inv, jcc_op, cond;
    MemOp size;
    CCPrepare cc;
    TCGv t0;

    inv = b & 1;
    jcc_op = (b >> 1) & 7;

    switch (s->cc_op) {
    case CC_OP_SUBB:
    case CC_OP_SUBW:
    case CC_OP_SUBL:
    case CC_OP_SUBQ:
        /* We optimize relational operators for the cmp/jcc case.  */
        size = s->cc_op - CC_OP_SUBB;
        switch (jcc_op) {
        case JCC_BE:
            tcg_gen_mov_tl(tcg_ctx, s->tmp4, s->cc_srcT);
            gen_extu(tcg_ctx, size, s->tmp4);
            t0 = gen_ext_tl(tcg_ctx, s->tmp0, tcg_ctx->cpu_cc_src, size, false);
            cc = (CCPrepare) { .cond = TCG_COND_LEU, .reg = s->tmp4,
                               .reg2 = t0, .mask = -1, .use_reg2 = true };
            break;

        case JCC_L:
            cond = TCG_COND_LT;
            goto fast_jcc_l;
        case JCC_LE:
            cond = TCG_COND_LE;
        fast_jcc_l:
            tcg_gen_mov_tl(tcg_ctx, s->tmp4, s->cc_srcT);
            gen_exts(tcg_ctx, size, s->tmp4);
            t0 = gen_ext_tl(tcg_ctx, s->tmp0, tcg_ctx->cpu_cc_src, size, true);
            cc = (CCPrepare) { .cond = cond, .reg = s->tmp4,
                               .reg2 = t0, .mask = -1, .use_reg2 = true };
            break;

        default:
            goto slow_jcc;
        }
        break;

    default:
    slow_jcc:
        /* This actually generates good code for JC, JZ and JS.  */
        switch (jcc_op) {
        case JCC_O:
            cc = gen_prepare_eflags_o(s, reg);
            break;
        case JCC_B:
            cc = gen_prepare_eflags_c(s, reg);
            break;
        case JCC_Z:
            cc = gen_prepare_eflags_z(s, reg);
            break;
        case JCC_BE:
            gen_compute_eflags(s);
            cc = (CCPrepare) { .cond = TCG_COND_NE, .reg = tcg_ctx->cpu_cc_src,
                               .mask = CC_Z | CC_C };
            break;
        case JCC_S:
            cc = gen_prepare_eflags_s(s, reg);
            break;
        case JCC_P:
            cc = gen_prepare_eflags_p(s, reg);
            break;
        case JCC_L:
            gen_compute_eflags(s);
            if (reg == tcg_ctx->cpu_cc_src) {
                reg = s->tmp0;
            }
            tcg_gen_shri_tl(tcg_ctx, reg, tcg_ctx->cpu_cc_src, 4); /* CC_O -> CC_S */
            tcg_gen_xor_tl(tcg_ctx, reg, reg, tcg_ctx->cpu_cc_src);
            cc = (CCPrepare) { .cond = TCG_COND_NE, .reg = reg,
                               .mask = CC_S };
            break;
        default:
        case JCC_LE:
            gen_compute_eflags(s);
            if (reg == tcg_ctx->cpu_cc_src) {
                reg = s->tmp0;
            }
            tcg_gen_shri_tl(tcg_ctx, reg, tcg_ctx->cpu_cc_src, 4); /* CC_O -> CC_S */
            tcg_gen_xor_tl(tcg_ctx, reg, reg, tcg_ctx->cpu_cc_src);
            cc = (CCPrepare) { .cond = TCG_COND_NE, .reg = reg,
                               .mask = CC_S | CC_Z };
            break;
        }
        break;
    }

    if (inv) {
        cc.cond = tcg_invert_cond(cc.cond);
    }
    return cc;
}